

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O2

void GetEntropyUnrefined_C(uint32_t *X,int length,VP8LBitEntropy *bit_entropy,VP8LStreaks *stats)

{
  uint uVar1;
  uint64_t uVar2;
  long lVar3;
  uint32_t x_prev;
  int i_prev;
  
  _x_prev = (ulong)*X;
  stats->counts[0] = 0;
  stats->counts[1] = 0;
  stats->streaks[0] = (int  [2])0x0;
  stats->streaks[1] = (int  [2])0x0;
  bit_entropy->entropy = 0;
  bit_entropy->sum = 0;
  bit_entropy->nonzeros = 0;
  bit_entropy->max_val = 0;
  bit_entropy->nonzero_code = 0xffff;
  for (lVar3 = 1; lVar3 < length; lVar3 = lVar3 + 1) {
    if (X[lVar3] != x_prev) {
      GetEntropyUnrefinedHelper(X[lVar3],(int)lVar3,&x_prev,&i_prev,bit_entropy,stats);
    }
  }
  GetEntropyUnrefinedHelper(0,(int)lVar3,&x_prev,&i_prev,bit_entropy,stats);
  uVar1 = bit_entropy->sum;
  if ((ulong)uVar1 < 0x100) {
    uVar2 = kSLog2Table[uVar1];
  }
  else {
    uVar2 = (*VP8LFastSLog2Slow)(uVar1);
  }
  bit_entropy->entropy = uVar2 - bit_entropy->entropy;
  return;
}

Assistant:

static void GetEntropyUnrefined_C(
    const uint32_t X[], int length,
    VP8LBitEntropy* WEBP_RESTRICT const bit_entropy,
    VP8LStreaks* WEBP_RESTRICT const stats) {
  int i;
  int i_prev = 0;
  uint32_t x_prev = X[0];

  memset(stats, 0, sizeof(*stats));
  VP8LBitEntropyInit(bit_entropy);

  for (i = 1; i < length; ++i) {
    const uint32_t x = X[i];
    if (x != x_prev) {
      GetEntropyUnrefinedHelper(x, i, &x_prev, &i_prev, bit_entropy, stats);
    }
  }
  GetEntropyUnrefinedHelper(0, i, &x_prev, &i_prev, bit_entropy, stats);

  bit_entropy->entropy = VP8LFastSLog2(bit_entropy->sum) - bit_entropy->entropy;
}